

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alloc.h
# Opt level: O1

void __thiscall
Minisat::RegionAllocator<unsigned_int>::capacity
          (RegionAllocator<unsigned_int> *this,uint32_t min_cap)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  uint *puVar4;
  int *piVar5;
  
  uVar1 = this->cap;
  if (min_cap <= uVar1) {
    return;
  }
  uVar2 = this->cap;
  do {
    if (min_cap <= uVar2) {
      if (uVar2 == 0) {
        __assert_fail("cap > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/Alloc.h"
                      ,0x68,
                      "void Minisat::RegionAllocator<unsigned int>::capacity(uint32_t) [T = unsigned int]"
                     );
      }
      puVar4 = (uint *)realloc(this->memory,(ulong)uVar2 << 2);
      if ((puVar4 != (uint *)0x0) || (piVar5 = __errno_location(), *piVar5 != 0xc)) {
        this->memory = puVar4;
        return;
      }
      break;
    }
    uVar2 = uVar2 + ((uVar2 >> 3) + (uVar2 >> 1) & 0xfffffffe) + 2;
    this->cap = uVar2;
  } while (uVar1 < uVar2);
  uVar3 = __cxa_allocate_exception(1);
  __cxa_throw(uVar3,&OutOfMemoryException::typeinfo,0);
}

Assistant:

void RegionAllocator<T>::capacity(uint32_t min_cap)
{
    if (cap >= min_cap) return;

    uint32_t prev_cap = cap;
    while (cap < min_cap){
        // NOTE: Multiply by a factor (13/8) without causing overflow, then add 2 and make the
        // result even by clearing the least significant bit. The resulting sequence of capacities
        // is carefully chosen to hit a maximum capacity that is close to the '2^32-1' limit when
        // using 'uint32_t' as indices so that as much as possible of this space can be used.
        uint32_t delta = ((cap >> 1) + (cap >> 3) + 2) & ~1;
        cap += delta;

        if (cap <= prev_cap)
            throw OutOfMemoryException();
    }
    // printf(" .. (%p) cap = %u\n", this, cap);

    assert(cap > 0);
    memory = (T*)xrealloc(memory, sizeof(T)*cap);
}